

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_internal.h
# Opt level: O3

void rpc_dplx_rut(rpc_dplx_rec *rec,char *func,int line)

{
  if (((byte)__ntirpc_pkg_params.debug_flags & 8) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%d unlocking @%s:%d","svc_xprt_lookup",(ulong)func & 0xffffffff,
               (rec->recv).lock.locktrace.func,(ulong)(uint)(rec->recv).lock.locktrace.line);
  }
  (rec->recv).lock.locktrace.line = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&rec->recv);
  return;
}

Assistant:

static inline void
rpc_dplx_rut(struct rpc_dplx_rec *rec, const char *func, int line)
{
	rpc_dplx_lock_t *lk = &rec->recv.lock;

	__warnx(TIRPC_DEBUG_FLAG_LOCK,
		"%s:%d unlocking @%s:%d",
		func, line,
		lk->locktrace.func,
		lk->locktrace.line);
	lk->locktrace.line = 0;
	mutex_unlock(&lk->we.mtx);
}